

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyexr.h
# Opt level: O0

mz_bool mz_zip_writer_finalize_archive(mz_zip_archive *pZip)

{
  mz_zip_internal_state *pmVar1;
  int iVar2;
  size_t sVar3;
  mz_uint8 local_48 [8];
  mz_uint8 hdr [22];
  mz_uint64 central_dir_size;
  mz_uint64 central_dir_ofs;
  mz_zip_internal_state *pState;
  mz_zip_archive *pZip_local;
  
  if (((pZip == (mz_zip_archive *)0x0) || (pZip->m_pState == (mz_zip_internal_state *)0x0)) ||
     (pZip->m_zip_mode != MZ_ZIP_MODE_WRITING)) {
    pZip_local._4_4_ = 0;
  }
  else {
    pmVar1 = pZip->m_pState;
    if ((pZip->m_total_files < 0x10000) &&
       (pZip->m_archive_size + (pmVar1->m_central_dir).m_size + 0x16 < 0x100000000)) {
      central_dir_size = 0;
      stack0xffffffffffffffd0 = 0;
      if (pZip->m_total_files != 0) {
        central_dir_size = pZip->m_archive_size;
        unique0x00012000 = (pmVar1->m_central_dir).m_size;
        pZip->m_central_directory_file_ofs = central_dir_size;
        sVar3 = (*pZip->m_pWrite)(pZip->m_pIO_opaque,central_dir_size,(pmVar1->m_central_dir).m_p,
                                  unique0x00012000);
        if (sVar3 != stack0xffffffffffffffd0) {
          return 0;
        }
        pZip->m_archive_size = stack0xffffffffffffffd0 + pZip->m_archive_size;
      }
      memset(local_48,0,0x16);
      (anonymous_namespace)::miniz::mz_write_le32(local_48,0x6054b50);
      (anonymous_namespace)::miniz::mz_write_le16(hdr,(mz_uint16)pZip->m_total_files);
      (anonymous_namespace)::miniz::mz_write_le16(hdr + 2,(mz_uint16)pZip->m_total_files);
      (anonymous_namespace)::miniz::mz_write_le32(hdr + 4,(mz_uint32)stack0xffffffffffffffd0);
      (anonymous_namespace)::miniz::mz_write_le32(hdr + 8,(mz_uint32)central_dir_size);
      sVar3 = (*pZip->m_pWrite)(pZip->m_pIO_opaque,pZip->m_archive_size,local_48,0x16);
      if (sVar3 == 0x16) {
        if ((pmVar1->m_pFile != (FILE *)0x0) &&
           (iVar2 = fflush((FILE *)pmVar1->m_pFile), iVar2 == -1)) {
          return 0;
        }
        pZip->m_archive_size = pZip->m_archive_size + 0x16;
        pZip->m_zip_mode = MZ_ZIP_MODE_WRITING_HAS_BEEN_FINALIZED;
        pZip_local._4_4_ = 1;
      }
      else {
        pZip_local._4_4_ = 0;
      }
    }
    else {
      pZip_local._4_4_ = 0;
    }
  }
  return pZip_local._4_4_;
}

Assistant:

mz_bool mz_zip_writer_finalize_archive(mz_zip_archive *pZip) {
  mz_zip_internal_state *pState;
  mz_uint64 central_dir_ofs, central_dir_size;
  mz_uint8 hdr[MZ_ZIP_END_OF_CENTRAL_DIR_HEADER_SIZE];

  if ((!pZip) || (!pZip->m_pState) || (pZip->m_zip_mode != MZ_ZIP_MODE_WRITING))
    return MZ_FALSE;

  pState = pZip->m_pState;

  // no zip64 support yet
  if ((pZip->m_total_files > 0xFFFF) ||
      ((pZip->m_archive_size + pState->m_central_dir.m_size +
        MZ_ZIP_END_OF_CENTRAL_DIR_HEADER_SIZE) > 0xFFFFFFFF))
    return MZ_FALSE;

  central_dir_ofs = 0;
  central_dir_size = 0;
  if (pZip->m_total_files) {
    // Write central directory
    central_dir_ofs = pZip->m_archive_size;
    central_dir_size = pState->m_central_dir.m_size;
    pZip->m_central_directory_file_ofs = central_dir_ofs;
    if (pZip->m_pWrite(pZip->m_pIO_opaque, central_dir_ofs,
                       pState->m_central_dir.m_p,
                       (size_t)central_dir_size) != central_dir_size)
      return MZ_FALSE;
    pZip->m_archive_size += central_dir_size;
  }

  // Write end of central directory record
  MZ_CLEAR_OBJ(hdr);
  MZ_WRITE_LE32(hdr + MZ_ZIP_ECDH_SIG_OFS,
                MZ_ZIP_END_OF_CENTRAL_DIR_HEADER_SIG);
  MZ_WRITE_LE16(hdr + MZ_ZIP_ECDH_CDIR_NUM_ENTRIES_ON_DISK_OFS,
                pZip->m_total_files);
  MZ_WRITE_LE16(hdr + MZ_ZIP_ECDH_CDIR_TOTAL_ENTRIES_OFS, pZip->m_total_files);
  MZ_WRITE_LE32(hdr + MZ_ZIP_ECDH_CDIR_SIZE_OFS, central_dir_size);
  MZ_WRITE_LE32(hdr + MZ_ZIP_ECDH_CDIR_OFS_OFS, central_dir_ofs);

  if (pZip->m_pWrite(pZip->m_pIO_opaque, pZip->m_archive_size, hdr,
                     sizeof(hdr)) != sizeof(hdr))
    return MZ_FALSE;
#ifndef MINIZ_NO_STDIO
  if ((pState->m_pFile) && (MZ_FFLUSH(pState->m_pFile) == EOF))
    return MZ_FALSE;
#endif // #ifndef MINIZ_NO_STDIO

  pZip->m_archive_size += sizeof(hdr);

  pZip->m_zip_mode = MZ_ZIP_MODE_WRITING_HAS_BEEN_FINALIZED;
  return MZ_TRUE;
}